

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-crosser.h
# Opt level: O0

_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
* capture_thread::ThreadCrosser::
  WrapFunction<bool,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
             *function)

{
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **in_RDI;
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **in_stack_ffffffffffffffc0;
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_30 [5];
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **function_00;
  
  function_00 = in_RDI;
  std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<bool(*&)(std::__cxx11::string_const&,std::__cxx11::string_const&),void>
            (in_stack_ffffffffffffffc0,local_30);
  WrapFunction<bool,std::__cxx11::string_const&,std::__cxx11::string_const&>(function_00);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               **)0x114889);
  return (_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *)in_RDI;
}

Assistant:

static inline std::function<Return(Args...)> WrapFunction(
      Return (*function)(Args...)) {
    return WrapFunction(std::function<Return(Args...)>(function));
  }